

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdGetMnemonicWord(void *handle,void *mnemonic_handle,uint32_t index,char **mnemonic_word)

{
  pointer pcVar1;
  long *plVar2;
  char *pcVar3;
  CfdException *pCVar4;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  pcVar1 = local_50 + 0x10;
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"GetMnemonicList","");
  cfd::capi::CheckBuffer(mnemonic_handle,(string *)local_50);
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (mnemonic_word != (char **)0x0) {
    plVar2 = *(long **)((long)mnemonic_handle + 0x10);
    if (plVar2 != (long *)0x0) {
      if ((ulong)index < (ulong)(plVar2[1] - *plVar2 >> 5)) {
        pcVar3 = cfd::capi::CreateString((string *)(*plVar2 + (ulong)index * 0x20));
        *mnemonic_word = pcVar3;
        return 0;
      }
    }
    local_50._0_8_ = "cfdcapi_key.cpp";
    local_50._8_4_ = 0x8c9;
    local_50._16_8_ = "CfdGetMnemonicWord";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"index is maximum over.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to parameter. index is maximum over.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)local_50);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_50._0_8_ = "cfdcapi_key.cpp";
  local_50._8_4_ = 0x8c0;
  local_50._16_8_ = "CfdGetMnemonicWord";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"mnemonic_word is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. mnemonic_word is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetMnemonicWord(
    void* handle, void* mnemonic_handle, uint32_t index,
    char** mnemonic_word) {
  try {
    cfd::Initialize();
    CheckBuffer(mnemonic_handle, kPrefixGetMnemonicWordList);
    if (mnemonic_word == nullptr) {
      warn(CFD_LOG_SOURCE, "mnemonic_word is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mnemonic_word is null.");
    }

    CfdCapiGetMnemonicWordList* buffer =
        static_cast<CfdCapiGetMnemonicWordList*>(mnemonic_handle);
    if ((buffer->wordlist == nullptr) || (index >= buffer->wordlist->size())) {
      warn(CFD_LOG_SOURCE, "index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index is maximum over.");
    }

    *mnemonic_word = CreateString((*buffer->wordlist)[index]);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}